

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_util.c
# Opt level: O0

int BrotliIsMostlyUTF8(uint8_t *data,size_t pos,size_t mask,size_t length,double min_fraction)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  size_t bytes_read;
  double dStack_40;
  int symbol;
  size_t i;
  size_t size_utf8;
  double min_fraction_local;
  size_t length_local;
  size_t mask_local;
  size_t pos_local;
  uint8_t *data_local;
  
  i = 0;
  dStack_40 = 0.0;
  size_utf8 = (size_t)min_fraction;
  min_fraction_local = (double)length;
  length_local = mask;
  mask_local = pos;
  pos_local = (size_t)data;
  while ((ulong)dStack_40 < (ulong)min_fraction_local) {
    sVar1 = BrotliParseAsUTF8((int *)((long)&bytes_read + 4),
                              (uint8_t *)(pos_local + (mask_local + (long)dStack_40 & length_local))
                              ,(long)min_fraction_local - (long)dStack_40);
    dStack_40 = (double)(sVar1 + (long)dStack_40);
    if (bytes_read._4_4_ < 0x110000) {
      i = sVar1 + i;
    }
  }
  auVar2._8_4_ = (int)(i >> 0x20);
  auVar2._0_8_ = i;
  auVar2._12_4_ = 0x45300000;
  auVar3._8_4_ = (int)((ulong)min_fraction_local >> 0x20);
  auVar3._0_8_ = min_fraction_local;
  auVar3._12_4_ = 0x45300000;
  return (uint)((double)size_utf8 *
                ((auVar3._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,SUB84(min_fraction_local,0)) - 4503599627370496.0)) <
               (auVar2._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0));
}

Assistant:

BROTLI_BOOL BrotliIsMostlyUTF8(
    const uint8_t* data, const size_t pos, const size_t mask,
    const size_t length, const double min_fraction) {
  size_t size_utf8 = 0;
  size_t i = 0;
  while (i < length) {
    int symbol;
    size_t bytes_read =
        BrotliParseAsUTF8(&symbol, &data[(pos + i) & mask], length - i);
    i += bytes_read;
    if (symbol < 0x110000) size_utf8 += bytes_read;
  }
  return TO_BROTLI_BOOL((double)size_utf8 > min_fraction * (double)length);
}